

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O3

void __thiscall
bssl::HPKETest_X25519EncapSmallOrderPoint_Test::TestBody
          (HPKETest_X25519EncapSmallOrderPoint_Test *this)

{
  code *pcVar1;
  int iVar2;
  EVP_HPKE_KEM *pEVar3;
  EVP_HPKE_KDF *pEVar4;
  EVP_HPKE_AEAD *pEVar5;
  char *in_R9;
  char *pcVar6;
  pointer *__ptr;
  long lVar7;
  ScopedTrace gtest_trace_489;
  ScopedTrace gtest_trace_487;
  size_t enc_len;
  uint8_t enc [32];
  ScopedEVP_HPKE_KEY key;
  ScopedEVP_HPKE_CTX recipient_ctx;
  ScopedEVP_HPKE_CTX sender_ctx;
  ScopedTrace local_6a2;
  ScopedTrace local_6a1;
  Message local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_698;
  undefined1 local_690 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_688;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_680;
  AssertHelper local_670;
  AssertHelper local_668;
  size_t local_660;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_658 [5];
  EVP_HPKE_KEY local_630;
  undefined1 local_5c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b0 [43];
  undefined1 local_2f8 [712];
  
  EVP_HPKE_KEY_zero(&local_630);
  pEVar3 = EVP_hpke_x25519_hkdf_sha256();
  iVar2 = EVP_HPKE_KEY_generate(&local_630,pEVar3);
  local_5c0[0] = (internal)(iVar2 != 0);
  local_5b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar2 == 0) {
    testing::Message::Message((Message *)local_658);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2f8,(internal *)local_5c0,
               (AssertionResult *)"EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256())",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_690,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
               ,0x1e4,(char *)CONCAT62(local_2f8._2_6_,local_2f8._0_2_));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_690,(Message *)local_658);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_690);
    if ((undefined1 *)CONCAT62(local_2f8._2_6_,local_2f8._0_2_) != local_2f8 + 0x10) {
      operator_delete((undefined1 *)CONCAT62(local_2f8._2_6_,local_2f8._0_2_),
                      (ulong)(local_2f8._16_8_ + 1));
    }
    if (local_658[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_658[0]._M_head_impl + 8))();
    }
    if (local_5b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_5b8,local_5b8);
    }
  }
  else {
    pEVar4 = EVP_hpke_hkdf_sha256();
    local_2f8._0_2_ = EVP_HPKE_KDF_id(pEVar4);
    testing::ScopedTrace::ScopedTrace<unsigned_short>
              (&local_6a1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
               ,0x1e7,(unsigned_short *)local_2f8);
    lVar7 = 0;
    do {
      pcVar1 = *(code **)((long)&(anonymous_namespace)::kAllAEADs + lVar7);
      pEVar5 = (EVP_HPKE_AEAD *)(*pcVar1)();
      local_2f8._0_2_ = EVP_HPKE_AEAD_id(pEVar5);
      testing::ScopedTrace::ScopedTrace<unsigned_short>
                (&local_6a2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                 ,0x1e9,(unsigned_short *)local_2f8);
      EVP_HPKE_CTX_zero((EVP_HPKE_CTX *)local_2f8);
      pEVar3 = EVP_hpke_x25519_hkdf_sha256();
      pEVar4 = EVP_hpke_hkdf_sha256();
      pEVar5 = (EVP_HPKE_AEAD *)(*pcVar1)();
      iVar2 = EVP_HPKE_CTX_setup_sender
                        ((EVP_HPKE_CTX *)local_2f8,(uint8_t *)local_658,&local_660,0x20,pEVar3,
                         pEVar4,pEVar5,TestBody::kSmallOrderPoint,0x20,(uint8_t *)0x0,0);
      local_690[0] = (internal)(iVar2 == 0);
      local_688 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_690[0]) {
        testing::Message::Message(&local_6a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_5c0,(internal *)local_690,
                   (AssertionResult *)
                   "EVP_HPKE_CTX_setup_sender( sender_ctx.get(), enc, &enc_len, sizeof(enc), EVP_hpke_x25519_hkdf_sha256(), kdf(), aead(), kSmallOrderPoint, sizeof(kSmallOrderPoint), nullptr, 0)"
                   ,"true","false",(char *)pEVar4);
        testing::internal::AssertHelper::AssertHelper
                  (&local_670,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                   ,0x1f1,(char *)CONCAT71(local_5c0._1_7_,local_5c0[0]));
        testing::internal::AssertHelper::operator=(&local_670,&local_6a0);
        testing::internal::AssertHelper::~AssertHelper(&local_670);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_5c0._1_7_,local_5c0[0]) != local_5b0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_5c0._1_7_,local_5c0[0]),
                          local_5b0[0]._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT71(local_6a0.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._1_7_,
                             local_6a0.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._0_1_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_6a0.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._1_7_,
                                         local_6a0.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._0_1_) + 8))();
        }
        if (local_688 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_688,local_688);
        }
      }
      pEVar4 = EVP_hpke_hkdf_sha256();
      pEVar5 = (EVP_HPKE_AEAD *)(*pcVar1)();
      iVar2 = EVP_HPKE_CTX_setup_auth_sender
                        ((EVP_HPKE_CTX *)local_2f8,(uint8_t *)local_658,&local_660,0x20,&local_630,
                         pEVar4,pEVar5,TestBody::kSmallOrderPoint,0x20,(uint8_t *)0x0,0);
      local_690[0] = (internal)(iVar2 == 0);
      local_688 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_690[0]) {
        testing::Message::Message(&local_6a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_5c0,(internal *)local_690,
                   (AssertionResult *)
                   "EVP_HPKE_CTX_setup_auth_sender( sender_ctx.get(), enc, &enc_len, sizeof(enc), key.get(), kdf(), aead(), kSmallOrderPoint, sizeof(kSmallOrderPoint), nullptr, 0)"
                   ,"true","false",(char *)pEVar4);
        testing::internal::AssertHelper::AssertHelper
                  (&local_670,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                   ,0x1f6,(char *)CONCAT71(local_5c0._1_7_,local_5c0[0]));
        testing::internal::AssertHelper::operator=(&local_670,&local_6a0);
        testing::internal::AssertHelper::~AssertHelper(&local_670);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_5c0._1_7_,local_5c0[0]) != local_5b0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_5c0._1_7_,local_5c0[0]),
                          local_5b0[0]._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT71(local_6a0.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._1_7_,
                             local_6a0.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._0_1_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_6a0.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._1_7_,
                                         local_6a0.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._0_1_) + 8))();
        }
        if (local_688 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_688,local_688);
        }
      }
      EVP_HPKE_CTX_zero((EVP_HPKE_CTX *)local_5c0);
      pEVar4 = EVP_hpke_hkdf_sha256();
      pEVar5 = (EVP_HPKE_AEAD *)(*pcVar1)();
      pcVar6 = &DAT_00000020;
      iVar2 = EVP_HPKE_CTX_setup_recipient
                        ((EVP_HPKE_CTX *)local_5c0,&local_630,pEVar4,pEVar5,
                         TestBody::kSmallOrderPoint,0x20,(uint8_t *)0x0,0);
      local_6a0.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ = (internal)(iVar2 == 0);
      local_698 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_6a0.ss_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._0_1_) {
        testing::Message::Message((Message *)&local_670);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_690,(internal *)&local_6a0,
                   (AssertionResult *)
                   "EVP_HPKE_CTX_setup_recipient( recipient_ctx.get(), key.get(), kdf(), aead(), kSmallOrderPoint, sizeof(kSmallOrderPoint), nullptr, 0)"
                   ,"true","false",pcVar6);
        testing::internal::AssertHelper::AssertHelper
                  (&local_668,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                   ,0x1fc,(char *)CONCAT71(local_690._1_7_,local_690[0]));
        testing::internal::AssertHelper::operator=(&local_668,(Message *)&local_670);
        testing::internal::AssertHelper::~AssertHelper(&local_668);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_690._1_7_,local_690[0]) != &local_680) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_690._1_7_,local_690[0]),
                          local_680._M_allocated_capacity + 1);
        }
        if (local_670.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_670.data_ + 8))();
        }
        if (local_698 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_698,local_698);
        }
      }
      pEVar4 = EVP_hpke_hkdf_sha256();
      pEVar5 = (EVP_HPKE_AEAD *)(*pcVar1)();
      pcVar6 = &DAT_00000020;
      iVar2 = EVP_HPKE_CTX_setup_auth_recipient
                        ((EVP_HPKE_CTX *)local_5c0,&local_630,pEVar4,pEVar5,
                         TestBody::kSmallOrderPoint,0x20,(uint8_t *)0x0,0,TestBody::kValidPoint,0x20
                        );
      local_6a0.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ = (internal)(iVar2 == 0);
      local_698 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_6a0.ss_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._0_1_) {
        testing::Message::Message((Message *)&local_670);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_690,(internal *)&local_6a0,
                   (AssertionResult *)
                   "EVP_HPKE_CTX_setup_auth_recipient( recipient_ctx.get(), key.get(), kdf(), aead(), kSmallOrderPoint, sizeof(kSmallOrderPoint), nullptr, 0, kValidPoint, sizeof(kValidPoint))"
                   ,"true","false",pcVar6);
        testing::internal::AssertHelper::AssertHelper
                  (&local_668,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                   ,0x203,(char *)CONCAT71(local_690._1_7_,local_690[0]));
        testing::internal::AssertHelper::operator=(&local_668,(Message *)&local_670);
        testing::internal::AssertHelper::~AssertHelper(&local_668);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_690._1_7_,local_690[0]) != &local_680) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_690._1_7_,local_690[0]),
                          local_680._M_allocated_capacity + 1);
        }
        if (local_670.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_670.data_ + 8))();
        }
        if (local_698 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_698,local_698);
        }
      }
      pEVar4 = EVP_hpke_hkdf_sha256();
      pEVar5 = (EVP_HPKE_AEAD *)(*pcVar1)();
      pcVar6 = &DAT_00000020;
      iVar2 = EVP_HPKE_CTX_setup_auth_recipient
                        ((EVP_HPKE_CTX *)local_5c0,&local_630,pEVar4,pEVar5,TestBody::kValidPoint,
                         0x20,(uint8_t *)0x0,0,TestBody::kSmallOrderPoint,0x20);
      local_6a0.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ = (internal)(iVar2 == 0);
      local_698 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_6a0.ss_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._0_1_) {
        testing::Message::Message((Message *)&local_670);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_690,(internal *)&local_6a0,
                   (AssertionResult *)
                   "EVP_HPKE_CTX_setup_auth_recipient( recipient_ctx.get(), key.get(), kdf(), aead(), kValidPoint, sizeof(kValidPoint), nullptr, 0, kSmallOrderPoint, sizeof(kSmallOrderPoint))"
                   ,"true","false",pcVar6);
        testing::internal::AssertHelper::AssertHelper
                  (&local_668,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                   ,0x207,(char *)CONCAT71(local_690._1_7_,local_690[0]));
        testing::internal::AssertHelper::operator=(&local_668,(Message *)&local_670);
        testing::internal::AssertHelper::~AssertHelper(&local_668);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_690._1_7_,local_690[0]) != &local_680) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_690._1_7_,local_690[0]),
                          local_680._M_allocated_capacity + 1);
        }
        if (local_670.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_670.data_ + 8))();
        }
        if (local_698 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_698,local_698);
        }
      }
      EVP_HPKE_CTX_cleanup((EVP_HPKE_CTX *)local_5c0);
      EVP_HPKE_CTX_cleanup((EVP_HPKE_CTX *)local_2f8);
      testing::ScopedTrace::~ScopedTrace(&local_6a2);
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x18);
    testing::ScopedTrace::~ScopedTrace(&local_6a1);
  }
  EVP_HPKE_KEY_cleanup(&local_630);
  return;
}

Assistant:

TEST(HPKETest, X25519EncapSmallOrderPoint) {
  // Borrowed from X25519Test.SmallOrder.
  static const uint8_t kSmallOrderPoint[32] = {
      0xe0, 0xeb, 0x7a, 0x7c, 0x3b, 0x41, 0xb8, 0xae, 0x16, 0x56, 0xe3,
      0xfa, 0xf1, 0x9f, 0xc4, 0x6a, 0xda, 0x09, 0x8d, 0xeb, 0x9c, 0x32,
      0xb1, 0xfd, 0x86, 0x62, 0x05, 0x16, 0x5f, 0x49, 0xb8,
  };
  static const uint8_t kValidPoint[32] = {
      0xe6, 0xdb, 0x68, 0x67, 0x58, 0x30, 0x30, 0xdb, 0x35, 0x94, 0xc1,
      0xa4, 0x24, 0xb1, 0x5f, 0x7c, 0x72, 0x66, 0x24, 0xec, 0x26, 0xb3,
      0x35, 0x3b, 0x10, 0xa9, 0x03, 0xa6, 0xd0, 0xab, 0x1c, 0x4c,
  };

  ScopedEVP_HPKE_KEY key;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()));

  for (const auto kdf : kAllKDFs) {
    SCOPED_TRACE(EVP_HPKE_KDF_id(kdf()));
    for (const auto aead : kAllAEADs) {
      SCOPED_TRACE(EVP_HPKE_AEAD_id(aead()));
      // Set up the sender, passing in kSmallOrderPoint as |peer_public_key|.
      ScopedEVP_HPKE_CTX sender_ctx;
      uint8_t enc[X25519_PUBLIC_VALUE_LEN];
      size_t enc_len;
      EXPECT_FALSE(EVP_HPKE_CTX_setup_sender(
          sender_ctx.get(), enc, &enc_len, sizeof(enc),
          EVP_hpke_x25519_hkdf_sha256(), kdf(), aead(), kSmallOrderPoint,
          sizeof(kSmallOrderPoint), nullptr, 0));

      // Likewise with auth.
      EXPECT_FALSE(EVP_HPKE_CTX_setup_auth_sender(
          sender_ctx.get(), enc, &enc_len, sizeof(enc), key.get(), kdf(),
          aead(), kSmallOrderPoint, sizeof(kSmallOrderPoint), nullptr, 0));

      // Set up the recipient, passing in kSmallOrderPoint as |enc|.
      ScopedEVP_HPKE_CTX recipient_ctx;
      EXPECT_FALSE(EVP_HPKE_CTX_setup_recipient(
          recipient_ctx.get(), key.get(), kdf(), aead(), kSmallOrderPoint,
          sizeof(kSmallOrderPoint), nullptr, 0));

      // Likewise with auth. With auth, a small-order point could appear as
      // either |enc| or the peer public key.
      EXPECT_FALSE(EVP_HPKE_CTX_setup_auth_recipient(
          recipient_ctx.get(), key.get(), kdf(), aead(), kSmallOrderPoint,
          sizeof(kSmallOrderPoint), nullptr, 0, kValidPoint,
          sizeof(kValidPoint)));
      EXPECT_FALSE(EVP_HPKE_CTX_setup_auth_recipient(
          recipient_ctx.get(), key.get(), kdf(), aead(), kValidPoint,
          sizeof(kValidPoint), nullptr, 0, kSmallOrderPoint,
          sizeof(kSmallOrderPoint)));
    }
  }
}